

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

bool __thiscall Bitmap::getPixelValue(Bitmap *this,int32_t pixel)

{
  byte local_1a;
  uint8_t data;
  uint8_t mask;
  int32_t index;
  int32_t pixel_local;
  Bitmap *this_local;
  
  local_1a = 0;
  if ((uint)pixel < (uint)this->length) {
    local_1a = this->data[pixel / 8];
  }
  return (local_1a & (byte)(0x80 >> ((byte)pixel & 7))) != 0;
}

Assistant:

bool Bitmap::getPixelValue(const int32_t pixel)
{
   const int32_t index = pixel / 8;
   const uint8_t mask = (0x80 >> (pixel & 7));
   uint8_t data = 0;

   //ignore all pixel that does not fit onto the lable
   if ((uint32_t)pixel < this->length)
   {
      //read respective byte
      data = this->data[index];
   }
   return ((data & mask) != 0);
}